

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# POSG.cpp
# Opt level: O1

void __thiscall POSG::POSG(POSG *this,void **vtt)

{
  void *pvVar1;
  
  pvVar1 = *vtt;
  *(void **)this = pvVar1;
  *(void **)(&this->field_0x0 + *(long *)((long)pvVar1 + -0x78)) = vtt[1];
  *(void **)(&this->field_0x0 + *(long *)(*(long *)this + -0x40)) = vtt[2];
  this->_m_initialized = false;
  this->_m_nrAgents = 0;
  (this->_m_discount).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_discount).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_discount).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_m_discount).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_m_rewardType).super__Vector_base<Globals::reward_t,_std::allocator<Globals::reward_t>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_rewardType).super__Vector_base<Globals::reward_t,_std::allocator<Globals::reward_t>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_rewardType).super__Vector_base<Globals::reward_t,_std::allocator<Globals::reward_t>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

POSG::POSG() 
{
    _m_initialized = false;
    _m_nrAgents = 0;
    //we can not call GetNrAgents from here...
    //instead this object will have to have the number of agents set and be
    //initialized.
    //_m_rewardType = vector<double>(GetNrAgents(), REWARD);
    //_m_discount = vector<double>(GetNrAgents(), 1.0);
}